

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

WhereBroadcastableLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::WhereBroadcastableLayerParams>
          (Arena *arena)

{
  WhereBroadcastableLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (WhereBroadcastableLayerParams *)operator_new(0x18);
    CoreML::Specification::WhereBroadcastableLayerParams::WhereBroadcastableLayerParams
              (this,(Arena *)0x0,false);
  }
  else {
    this = (WhereBroadcastableLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x18,
                      (type_info *)&CoreML::Specification::WhereBroadcastableLayerParams::typeinfo);
    CoreML::Specification::WhereBroadcastableLayerParams::WhereBroadcastableLayerParams
              (this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }